

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

shared_ptr<helics::BrokerFactory::MasterBrokerBuilder> *
helics::BrokerFactory::MasterBrokerBuilder::instance(void)

{
  int iVar1;
  
  if (instance()::iptr == '\0') {
    iVar1 = __cxa_guard_acquire(&instance()::iptr);
    if (iVar1 != 0) {
      instance::iptr.
      super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)operator_new(0x18);
      ((instance::iptr.
        super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ((instance::iptr.
        super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((instance::iptr.
        super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->builders).
      super__Vector_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<helics::BrokerFactory::BrokerBuilder>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::BrokerFactory::MasterBrokerBuilder*>
                (&instance::iptr.
                  super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 instance::iptr.
                 super___shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_atexit(std::
                   __shared_ptr<helics::BrokerFactory::MasterBrokerBuilder,_(__gnu_cxx::_Lock_policy)2>
                   ::~__shared_ptr,&instance::iptr,&__dso_handle);
      __cxa_guard_release(&instance()::iptr);
    }
  }
  return &instance::iptr;
}

Assistant:

static const std::shared_ptr<MasterBrokerBuilder>& instance()
    {
        static const std::shared_ptr<MasterBrokerBuilder> iptr(new MasterBrokerBuilder());
        return iptr;
    }